

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O2

void __thiscall Indexing::Index::attachContainer(Index *this,ClauseContainer *cc)

{
  SmartPtr<Lib::SubscriptionObject> SStack_28;
  
  Lib::SingleParamEvent<Kernel::Clause_*>::subscribe<Indexing::Index>
            ((SingleParamEvent<Kernel::Clause_*> *)&SStack_28,(Index *)&cc->addedEvent,
             (offset_in_Index_to_subr)this);
  Lib::SmartPtr<Lib::SubscriptionObject>::operator=(&this->_addedSD,&SStack_28);
  Lib::SmartPtr<Lib::SubscriptionObject>::~SmartPtr(&SStack_28);
  Lib::SingleParamEvent<Kernel::Clause_*>::subscribe<Indexing::Index>
            ((SingleParamEvent<Kernel::Clause_*> *)&SStack_28,(Index *)&cc->removedEvent,
             (offset_in_Index_to_subr)this);
  Lib::SmartPtr<Lib::SubscriptionObject>::operator=(&this->_removedSD,&SStack_28);
  Lib::SmartPtr<Lib::SubscriptionObject>::~SmartPtr(&SStack_28);
  return;
}

Assistant:

void Index::attachContainer(ClauseContainer* cc)
{
  ASS(_addedSD.isEmpty()); //only one container can be attached

  _addedSD = cc->addedEvent.subscribe(this,&Index::onAddedToContainer);
  _removedSD = cc->removedEvent.subscribe(this,&Index::onRemovedFromContainer);
}